

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

void mark_as_moved(gen_ctx_t gen_ctx,bb_insn_t_conflict bb_insn,
                  bitmap_t loop_invariant_bb_insn_bitmap,bitmap_t bb_insns_to_move_bitmap)

{
  ulong *puVar1;
  uint uVar2;
  void *pvVar3;
  c2mir_ctx *pcVar4;
  gen_ctx *before;
  MIR_insn_t pMVar5;
  bitmap_t pVVar6;
  MIR_op_t *pMVar7;
  int iVar8;
  gen_ctx_t pgVar9;
  VARR_bb_insn_t *pVVar10;
  ulong uVar11;
  ulong uVar12;
  bb_insn_t_conflict *__ptr;
  size_t sVar13;
  size_t sVar14;
  bb_insn_t insn;
  ulong nop;
  MIR_context_t before_00;
  bb_insn_t_conflict pbVar15;
  MIR_func_t bb_insn_00;
  gen_ctx_t gen_ctx_00;
  MIR_insn_t pMVar16;
  ulong uVar17;
  bool bVar18;
  int local_64;
  ulong local_60;
  bb_insn_t_conflict local_58;
  MIR_insn_t local_50;
  bitmap_t local_48;
  bb_insn_t_conflict local_40;
  MIR_op_t *local_38;
  
  pVVar10 = gen_ctx->temp_bb_insns2;
  if ((pVVar10 != (VARR_bb_insn_t *)0x0) &&
     (pgVar9 = (gen_ctx_t)pVVar10->varr, pgVar9 != (gen_ctx_t)0x0)) {
    pVVar10->els_num = 0;
    if (pVVar10->size == 0) {
      before_00 = (MIR_context_t)0x8;
      gen_ctx_00 = pgVar9;
      pgVar9 = (gen_ctx_t)realloc(pgVar9,8);
      pVVar10->varr = (bb_insn_t_conflict *)pgVar9;
      pVVar10->size = 1;
      sVar13 = pVVar10->els_num;
      sVar14 = sVar13 + 1;
    }
    else {
      sVar14 = 1;
      sVar13 = 0;
      before_00 = (MIR_context_t)bb_insn;
      gen_ctx_00 = gen_ctx;
    }
    pVVar10->els_num = sVar14;
    pgVar9->call_used_hard_regs[sVar13 - 0xd] = (bitmap_t)bb_insn;
    if (loop_invariant_bb_insn_bitmap == (bitmap_t)0x0) {
      mark_as_moved_cold_5();
      if ((gen_ctx_00 == (gen_ctx_t)0x0) || (before_00 == (MIR_context_t)0x0)) {
        DLIST_MIR_insn_t_remove_cold_1();
LAB_00169530:
        DLIST_MIR_insn_t_remove_cold_2();
      }
      else {
        pcVar4 = before_00->c2mir_ctx;
        if (pcVar4 == (c2mir_ctx *)0x0) {
          if (gen_ctx_00->ctx != before_00) goto LAB_00169530;
          pgVar9 = (gen_ctx_t)before_00->error_func;
          gen_ctx_00->ctx = (MIR_context_t)pgVar9;
        }
        else {
          pgVar9 = (gen_ctx_t)before_00->error_func;
          *(gen_ctx_t *)(pcVar4 + 0x10) = pgVar9;
        }
        if ((pgVar9 != (gen_ctx_t)0x0) ||
           (pgVar9 = gen_ctx_00, *(MIR_context_t *)&gen_ctx_00->optimize_level == before_00)) {
          *(c2mir_ctx **)&pgVar9->optimize_level = pcVar4;
          before_00->c2mir_ctx = (c2mir_ctx *)0x0;
          before_00->error_func = (MIR_error_func_t)0x0;
          return;
        }
      }
      DLIST_MIR_insn_t_remove_cold_3();
      before = before_00->gen_ctx;
      pbVar15 = (bb_insn_t_conflict)insn->insn;
      pMVar5 = ((DLIST_LINK_MIR_insn_t *)&insn->gvn_val_const_p)->prev;
      bb_insn_00 = (gen_ctx_00->curr_func_item->u).func;
      if (pMVar5 == (MIR_insn_t)0x0) {
        if ((bb_insn_t)(bb_insn_00->insns).head != insn) {
          gen_move_insn_before_cold_1();
          goto LAB_001695e1;
        }
        pMVar16 = *(MIR_insn_t *)&insn->mem_index;
        (bb_insn_00->insns).head = pMVar16;
      }
      else {
        pMVar16 = *(MIR_insn_t *)&insn->mem_index;
        (pMVar5->insn_link).next = pMVar16;
      }
      if (pMVar16 == (MIR_insn_t)0x0) {
        if (((DLIST_LINK_bb_insn_t *)&(bb_insn_00->insns).tail)->prev != insn) {
LAB_001695e1:
          gen_move_insn_before_cold_2();
          iVar8 = ssa_dead_insn_p(gen_ctx_00,(bb_insn_t_conflict)bb_insn_00);
          if (iVar8 != 0) {
            if (((FILE *)gen_ctx_00->debug_file != (FILE *)0x0) && (1 < gen_ctx_00->debug_level)) {
              fwrite("  deleting now dead insn ",0x19,1,(FILE *)gen_ctx_00->debug_file);
              print_bb_insn(gen_ctx_00,(bb_insn_t_conflict)bb_insn_00,0);
            }
            pMVar5 = (MIR_insn_t)bb_insn_00->name;
            remove_insn_ssa_edges(pMVar5);
            gen_delete_insn(gen_ctx_00,pMVar5);
          }
          return;
        }
        pMVar16 = (MIR_insn_t)&bb_insn_00->insns;
      }
      (pMVar16->insn_link).prev = pMVar5;
      ((DLIST_LINK_MIR_insn_t *)&insn->gvn_val_const_p)->prev = (MIR_insn_t)0x0;
      *(MIR_insn_t *)&insn->mem_index = (MIR_insn_t)0x0;
      MIR_insert_insn_before
                (gen_ctx_00->ctx,gen_ctx_00->curr_func_item,(MIR_insn_t_conflict)before_00,
                 (MIR_insn_t_conflict)insn);
      DLIST_bb_insn_t_remove(&pbVar15->bb->bb_insns,pbVar15);
      DLIST_bb_insn_t_insert_before
                (&(*(bb_t_conflict *)&before->addr_insn_p)->bb_insns,(bb_insn_t_conflict)before,
                 pbVar15);
      pbVar15->bb = *(bb_t_conflict *)&before->addr_insn_p;
      return;
    }
    uVar2 = bb_insn->index;
    local_48 = bb_insns_to_move_bitmap;
    if ((loop_invariant_bb_insn_bitmap->els_num << 6 <= (ulong)uVar2) ||
       ((loop_invariant_bb_insn_bitmap->varr[uVar2 >> 6] >> ((ulong)uVar2 & 0x3f) & 1) == 0))
    goto LAB_001694b4;
    pVVar10 = gen_ctx->temp_bb_insns2;
    while (pVVar6 = local_48, pVVar10 != (VARR_bb_insn_t *)0x0) {
      sVar14 = pVVar10->els_num;
      if (sVar14 == 0) {
        return;
      }
      if (pVVar10->varr == (bb_insn_t_conflict *)0x0) goto LAB_001694a5;
      pVVar10->els_num = sVar14 - 1;
      pbVar15 = pVVar10->varr[sVar14 - 1];
      uVar2 = pbVar15->index;
      bitmap_expand(local_48,(ulong)uVar2 + 1);
      if (pVVar6 == (bitmap_t)0x0) goto LAB_001694aa;
      puVar1 = pVVar6->varr + (uVar2 >> 6);
      *puVar1 = *puVar1 | 1L << ((ulong)uVar2 & 0x3f);
      local_50 = pbVar15->insn;
      local_60 = *(ulong *)&local_50->field_0x18 >> 0x20;
      local_58 = pbVar15;
      if (local_60 != 0) {
        nop = 0;
        local_38 = local_50->ops;
        uVar12 = 0;
        do {
          pMVar7 = local_38;
          uVar17 = uVar12;
          while( true ) {
            MIR_insn_op_mode(gen_ctx->ctx,local_50,nop,&local_64);
            if ((local_64 != 0) && (uVar12 = uVar17, pMVar7[nop].field_0x8 != '\v'))
            goto LAB_00169474;
            if (1 < uVar17) break;
            uVar11 = uVar17;
            while (pMVar7[nop].field_0x8 == '\v') {
              if (*(int *)((long)&pMVar7[nop].u + (ulong)(uVar11 != 0) * 4 + 0x10) != -1)
              goto LAB_001693bb;
              bVar18 = uVar11 != 0;
              uVar11 = 1;
              if (bVar18) goto LAB_00169472;
            }
            if (uVar17 == 1) break;
            uVar12 = 0;
            uVar11 = uVar17;
            if (pMVar7[nop].field_0x8 != '\x02') goto LAB_00169474;
LAB_001693bb:
            pvVar3 = local_58->insn->ops[(int)nop].data;
            if (pvVar3 != (void *)0x0) {
              uVar2 = local_58->index;
              if (((ulong)uVar2 < loop_invariant_bb_insn_bitmap->els_num << 6) &&
                 ((loop_invariant_bb_insn_bitmap->varr[uVar2 >> 6] >> ((ulong)uVar2 & 0x3f) & 1) !=
                  0)) {
                pVVar10 = gen_ctx->temp_bb_insns2;
                __ptr = pVVar10->varr;
                if (__ptr == (bb_insn_t_conflict *)0x0) {
                  mark_as_moved_cold_1();
                  goto LAB_001694a0;
                }
                sVar14 = pVVar10->els_num;
                pbVar15 = *(bb_insn_t_conflict *)((long)pvVar3 + 8);
                uVar12 = sVar14 + 1;
                if (pVVar10->size < uVar12) {
                  sVar14 = (uVar12 >> 1) + uVar12;
                  local_40 = pbVar15;
                  __ptr = (bb_insn_t_conflict *)realloc(__ptr,sVar14 * 8);
                  pVVar10->varr = __ptr;
                  pVVar10->size = sVar14;
                  sVar14 = pVVar10->els_num;
                  uVar12 = sVar14 + 1;
                  pbVar15 = local_40;
                }
                pVVar10->els_num = uVar12;
                __ptr[sVar14] = pbVar15;
              }
            }
            uVar17 = uVar11 + 1;
            if (local_60 <= nop) goto LAB_00169304;
          }
LAB_00169472:
          uVar12 = 0;
LAB_00169474:
          nop = nop + 1;
        } while (nop < local_60);
      }
LAB_00169304:
      pVVar10 = gen_ctx->temp_bb_insns2;
    }
LAB_001694a0:
    mark_as_moved_cold_4();
LAB_001694a5:
    mark_as_moved_cold_3();
LAB_001694aa:
    mark_as_moved_cold_2();
  }
  mark_as_moved_cold_6();
LAB_001694b4:
  __assert_fail("bitmap_bit_p (loop_invariant_bb_insn_bitmap, bb_insn->index)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x14e9,"void mark_as_moved(gen_ctx_t, bb_insn_t, bitmap_t, bitmap_t)");
}

Assistant:

static void mark_as_moved (gen_ctx_t gen_ctx, bb_insn_t bb_insn,
                           bitmap_t loop_invariant_bb_insn_bitmap,
                           bitmap_t bb_insns_to_move_bitmap) {
  int op_num;
  MIR_reg_t var;
  insn_var_iterator_t iter;
  ssa_edge_t se;

  VARR_TRUNC (bb_insn_t, temp_bb_insns2, 0);
  VARR_PUSH (bb_insn_t, temp_bb_insns2, bb_insn);
  gen_assert (bitmap_bit_p (loop_invariant_bb_insn_bitmap, bb_insn->index));
  while (VARR_LENGTH (bb_insn_t, temp_bb_insns2) != 0) {
    bb_insn = VARR_POP (bb_insn_t, temp_bb_insns2);
    bitmap_set_bit_p (bb_insns_to_move_bitmap, bb_insn->index);
    FOREACH_IN_INSN_VAR (gen_ctx, iter, bb_insn->insn, var, op_num)
    if ((se = bb_insn->insn->ops[op_num].data) != NULL
        && bitmap_bit_p (loop_invariant_bb_insn_bitmap, bb_insn->index))
      VARR_PUSH (bb_insn_t, temp_bb_insns2, se->def);
  }
}